

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QColor __thiscall QAccessibleWidget::foregroundColor(QAccessibleWidget *this)

{
  QWidget *pQVar1;
  QPalette *pQVar2;
  QWidget *pQVar3;
  long *plVar4;
  
  pQVar1 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
  if ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x30) & 1) == 0) {
    pQVar1 = (QWidget *)0x0;
  }
  pQVar2 = QWidget::palette(pQVar1);
  pQVar3 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
  pQVar1 = (QWidget *)0x0;
  if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0) {
    pQVar1 = pQVar3;
  }
  QWidget::foregroundRole(pQVar1);
  plVar4 = (long *)QPalette::brush((ColorGroup)pQVar2,Dark);
  return *(QColor *)(*plVar4 + 8);
}

Assistant:

QColor QAccessibleWidget::foregroundColor() const
{
    return widget()->palette().color(widget()->foregroundRole());
}